

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O1

void __thiscall RedBlackTree::leftRotate(RedBlackTree *this,Node **ptr)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = (*ptr)->right;
  (*ptr)->right = pNVar1->left;
  pNVar2 = (*ptr)->right;
  if (pNVar2 != (Node *)0x0) {
    pNVar2->parent = *ptr;
  }
  pNVar1->parent = (*ptr)->parent;
  pNVar2 = (*ptr)->parent;
  if (pNVar2 != (Node *)0x0) {
    this = (RedBlackTree *)&pNVar2->right;
    if (*ptr == pNVar2->left) {
      this = (RedBlackTree *)&pNVar2->left;
    }
  }
  *this = (RedBlackTree)pNVar1;
  pNVar1->left = *ptr;
  (*ptr)->parent = pNVar1;
  return;
}

Assistant:

void RedBlackTree::leftRotate(Node *&ptr) {
    Node *right_child = ptr->right;
    ptr->right = right_child->left;

    if (ptr->right != nullptr) {
        ptr->right->parent = ptr;
    }
    right_child->parent = ptr->parent;

    if (ptr->parent == nullptr) {
        root = right_child;
    } else if (ptr == ptr->parent->left) {
        ptr->parent->left = right_child;
    } else {
        ptr->parent->right = right_child;
    }

    right_child->left = ptr;
    ptr->parent = right_child;
}